

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  rawSeq *prVar1;
  uint minMatch;
  ZSTD_strategy strat;
  BYTE *pBVar2;
  seqDef *psVar3;
  undefined8 uVar4;
  ZSTD_dictMode_e dictMode;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  uint uVar12;
  ulong uVar13;
  BYTE *iend;
  ulong uVar14;
  
  minMatch = (ms->cParams).minMatch;
  strat = (ms->cParams).strategy;
  dictMode = ZSTD_matchState_dictMode(ms);
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor(strat,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar5 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar5;
  }
  uVar14 = rawSeqStore->pos;
  uVar8 = rawSeqStore->size;
  if (uVar8 < uVar14) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7efb,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < uVar8) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7efc,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  pBVar11 = (BYTE *)(srcSize + (long)src);
  while ((uVar13 = (long)pBVar11 - (long)src, uVar14 < uVar8 && (src < pBVar11))) {
    prVar1 = rawSeqStore->seq + uVar14;
    uVar8._0_4_ = prVar1->offset;
    uVar8._4_4_ = prVar1->litLength;
    if ((undefined4)uVar8 == 0) {
      __assert_fail("sequence.offset > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7ebd,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
    }
    uVar9 = uVar8 >> 0x20;
    uVar7 = rawSeqStore->seq[uVar14].matchLength;
    uVar12 = (uint)uVar13;
    if (uVar12 < uVar7 + uVar8._4_4_) {
      ZSTD_ldm_skipSequences(rawSeqStore,uVar13 & 0xffffffff,minMatch);
      uVar14 = uVar8 & 0xffffffff;
      if (uVar12 - uVar8._4_4_ < minMatch) {
        uVar14 = 0;
      }
      uVar7 = uVar12 - uVar8._4_4_;
      if ((uVar12 < (uint)uVar8._4_4_ || uVar7 == 0) || (uVar8 = uVar14, uVar7 < minMatch)) break;
    }
    else {
      rawSeqStore->pos = uVar14 + 1;
    }
    iend = (BYTE *)((long)src + uVar9);
    if (pBVar11 < iend + uVar7) {
      __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7f07,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                   );
    }
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,src);
    sVar5 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar9);
    for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -4) {
      *(undefined4 *)((long)rep + lVar6) = *(undefined4 *)((long)rep + lVar6 + -4);
    }
    *rep = (U32)uVar8;
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar2 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar2 + sVar5) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar11 < iend) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar10 = iend + -sVar5;
    if (pBVar11 + -0x20 < iend) {
      ZSTD_safecopyLiterals(pBVar2,pBVar10,iend,pBVar11 + -0x20);
LAB_0019b602:
      seqStore->lit = seqStore->lit + sVar5;
      if (0xffff < sVar5) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)(pBVar10 + 8);
      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar10;
      *(undefined8 *)(pBVar2 + 8) = uVar4;
      pBVar2 = seqStore->lit;
      if (0x10 < sVar5) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar2 + 0x10 + (-0x10 - (long)(pBVar10 + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)(pBVar10 + 0x18);
        *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(pBVar10 + 0x10);
        *(undefined8 *)(pBVar2 + 0x18) = uVar4;
        if (0x20 < (long)sVar5) {
          lVar6 = 0;
          do {
            uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar6 + (uVar9 - sVar5) + 0x20) + 8);
            pBVar10 = pBVar2 + lVar6 + 0x20;
            *(undefined8 *)pBVar10 = *(undefined8 *)((long)src + lVar6 + (uVar9 - sVar5) + 0x20);
            *(undefined8 *)(pBVar10 + 8) = uVar4;
            uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar6 + (uVar9 - sVar5) + 0x30) + 8);
            *(undefined8 *)(pBVar10 + 0x10) =
                 *(undefined8 *)((long)src + lVar6 + (uVar9 - sVar5) + 0x30);
            *(undefined8 *)(pBVar10 + 0x18) = uVar4;
            lVar6 = lVar6 + 0x20;
          } while (pBVar10 + 0x20 < pBVar2 + sVar5);
        }
        goto LAB_0019b602;
      }
      seqStore->lit = pBVar2 + sVar5;
    }
    psVar3 = seqStore->sequences;
    psVar3->litLength = (U16)sVar5;
    psVar3->offBase = (U32)uVar8 + 3;
    if (uVar7 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar14 = (ulong)uVar7 - 3;
    if (0xffff < uVar14) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar3->mlBase = (U16)uVar14;
    seqStore->sequences = psVar3 + 1;
    uVar14 = rawSeqStore->pos;
    uVar8 = rawSeqStore->size;
    src = iend + uVar7;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,src);
  sVar5 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar13);
  return sVar5;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}